

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O2

void nghttp2_pq_remove(nghttp2_pq *pq,nghttp2_pq_entry *item)

{
  size_t sVar1;
  nghttp2_pq_entry **ppnVar2;
  size_t sVar3;
  int iVar4;
  
  ppnVar2 = pq->q;
  sVar3 = item->index;
  if (ppnVar2[sVar3] != item) {
    __assert_fail("pq->q[item->index] == item",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_pq.c"
                  ,0x80,"void nghttp2_pq_remove(nghttp2_pq *, nghttp2_pq_entry *)");
  }
  if (sVar3 == 0) {
    nghttp2_pq_pop(pq);
    return;
  }
  sVar1 = pq->length - 1;
  if (sVar3 == sVar1) {
    pq->length = sVar3;
    return;
  }
  ppnVar2[sVar3] = ppnVar2[pq->length - 1];
  ppnVar2 = pq->q;
  ppnVar2[sVar3]->index = sVar3;
  pq->length = sVar1;
  iVar4 = (*pq->less)(item,ppnVar2[item->index]);
  if (iVar4 != 0) {
    bubble_down(pq,item->index);
    return;
  }
  bubble_up(pq,item->index);
  return;
}

Assistant:

void nghttp2_pq_remove(nghttp2_pq *pq, nghttp2_pq_entry *item) {
  assert(pq->q[item->index] == item);

  if (item->index == 0) {
    nghttp2_pq_pop(pq);
    return;
  }

  if (item->index == pq->length - 1) {
    --pq->length;
    return;
  }

  pq->q[item->index] = pq->q[pq->length - 1];
  pq->q[item->index]->index = item->index;
  --pq->length;

  if (pq->less(item, pq->q[item->index])) {
    bubble_down(pq, item->index);
  } else {
    bubble_up(pq, item->index);
  }
}